

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_sint64 memoryIo_read(PHYSFS_Io *io,void *buf,PHYSFS_uint64 len)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  
  plVar1 = (long *)io->opaque;
  uVar2 = plVar1[2];
  uVar3 = plVar1[1] - uVar2;
  if (uVar2 <= (ulong)plVar1[1]) {
    if (uVar3 == 0) {
      len = 0;
    }
    else {
      if (uVar3 < len) {
        len = uVar3;
      }
      memcpy(buf,(void *)(uVar2 + *plVar1),len);
      plVar1[2] = plVar1[2] + len;
    }
    return len;
  }
  __assert_fail("avail <= info->len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                ,0x100,"PHYSFS_sint64 memoryIo_read(PHYSFS_Io *, void *, PHYSFS_uint64)");
}

Assistant:

static PHYSFS_sint64 memoryIo_read(PHYSFS_Io *io, void *buf, PHYSFS_uint64 len)
{
    MemoryIoInfo *info = (MemoryIoInfo *) io->opaque;
    const PHYSFS_uint64 avail = info->len - info->pos;
    assert(avail <= info->len);

    if (avail == 0)
        return 0;  /* we're at EOF; nothing to do. */

    if (len > avail)
        len = avail;

    memcpy(buf, info->buf + info->pos, (size_t) len);
    info->pos += len;
    return len;
}